

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::TableType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          *values,TableType *out,char *desc)

{
  uint uVar1;
  pointer pTVar2;
  Result RVar3;
  undefined4 uVar4;
  Enum EVar5;
  undefined4 local_a0;
  undefined2 local_9c;
  uint64_t local_98;
  uint64_t uStack_90;
  undefined2 local_88;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar3 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 5),desc);
  Var::~Var(&local_78);
  if (out != (TableType *)0x0) {
    if (RVar3.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h"
                      ,0x38,"Index wabt::Var::index() const");
      }
      uVar1 = (var->field_2).index_;
      pTVar2 = (values->
               super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      EVar5 = pTVar2[uVar1].element.enum_;
      uVar4 = *(undefined4 *)&pTVar2[uVar1].field_0x4;
      local_88._0_1_ = pTVar2[uVar1].limits.has_max;
      local_88._1_1_ = pTVar2[uVar1].limits.is_shared;
      local_98 = pTVar2[uVar1].limits.initial;
      uStack_90 = pTVar2[uVar1].limits.max;
      local_a0 = *(undefined4 *)&pTVar2[uVar1].limits.field_0x12;
      local_9c = *(undefined2 *)&pTVar2[uVar1].limits.field_0x16;
    }
    else {
      uVar4 = 0;
      local_9c = 0;
      local_a0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      EVar5 = Any;
    }
    (out->element).enum_ = EVar5;
    *(undefined4 *)&out->field_0x4 = uVar4;
    (out->limits).initial = local_98;
    (out->limits).max = uStack_90;
    (out->limits).has_max = (bool)(undefined1)local_88;
    (out->limits).is_shared = (bool)local_88._1_1_;
    *(undefined4 *)&(out->limits).field_0x12 = local_a0;
    *(undefined2 *)&(out->limits).field_0x16 = local_9c;
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}